

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::TestWebSocketService::request
          (TestWebSocketService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  uint uVar1;
  _func_int *p_Var2;
  undefined8 uVar3;
  bool bVar4;
  undefined4 in_register_00000034;
  long lVar5;
  HttpHeaderId id;
  StringPtr message;
  long *in_stack_00000010;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_df;
  StringPtr *local_d8;
  _func_int *local_d0;
  Array<char> local_c8;
  StringPtr url_local;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_a0;
  HttpHeaders responseHeaders;
  undefined1 local_30 [8];
  undefined8 local_28;
  
  lVar5 = CONCAT44(in_register_00000034,method);
  url_local.content.ptr = (char *)url.content.size_;
  url_local.content.size_ = (size_t)headers;
  bVar4 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  _kjCondition.value = bVar4;
  if (!bVar4) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&responseHeaders,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x9ec,FAILED,"headers.isWebSocket()","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal((Fault *)&responseHeaders);
  }
  HttpHeaders::HttpHeaders(&responseHeaders,*(HttpHeaderTable **)(lVar5 + 0x10));
  uVar1 = *(uint *)(lVar5 + 0x20);
  p_Var2 = requestBody[1]._vptr_AsyncInputStream[(ulong)uVar1 * 2 + 1];
  if ((_func_int *)0x1 < p_Var2) {
    local_d8 = (StringPtr *)requestBody[1]._vptr_AsyncInputStream[(ulong)uVar1 * 2];
    _kjCondition.value = true;
    uVar3 = *(undefined8 *)(lVar5 + 0x18);
    local_d0 = p_Var2;
    str<char_const(&)[9],kj::StringPtr&>
              ((String *)&local_c8,(kj *)"respond-",(char (*) [9])&local_d8,local_d8);
    id.id = uVar1;
    id.table = (HttpHeaderTable *)uVar3;
    id._12_4_ = 0;
    HttpHeaders::set(&responseHeaders,id,(String *)&local_c8);
    Array<char>::~Array(&local_c8);
  }
  __kjCondition = (Exception *)0x4227b9;
  local_d8 = (StringPtr *)0xe;
  bVar4 = ArrayPtr<const_char>::operator==(&url_local.content,(ArrayPtr<const_char> *)&_kjCondition)
  ;
  if (bVar4) {
    local_30[0] = 1;
    local_28 = 0;
    (**(code **)*in_stack_00000010)
              (&local_a0,in_stack_00000010,0x194,"Not Found",10,&responseHeaders,local_30);
    Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose(&local_a0);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    __kjCondition = (Exception *)0x42008a;
    local_d8 = (StringPtr *)&DAT_0000000b;
    bVar4 = ArrayPtr<const_char>::operator==
                      (&url_local.content,(ArrayPtr<const_char> *)&_kjCondition);
    if (!bVar4) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16],kj::StringPtr&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x9fa,FAILED,(char *)0x0,"\"unexpected path\", url",
                 (char (*) [16])"unexpected path",(StringPtr *)&url_local.content);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    (**(code **)(*in_stack_00000010 + 8))(&_kjCondition,in_stack_00000010,&responseHeaders);
    message.content.size_ = (size_t)"start-inline";
    message.content.ptr = (char *)local_d8;
    doWebSocket((WebSocket *)&local_c8,message);
    Promise<void>::attach<kj::Own<kj::WebSocket,decltype(nullptr)>>
              ((Promise<void> *)this,(Own<kj::WebSocket,_std::nullptr_t> *)&local_c8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_c8);
    Own<kj::WebSocket,_std::nullptr_t>::dispose((Own<kj::WebSocket,_std::nullptr_t> *)&_kjCondition)
    ;
  }
  HttpHeaders::~HttpHeaders(&responseHeaders);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    KJ_ASSERT(headers.isWebSocket());

    HttpHeaders responseHeaders(headerTable);
    KJ_IF_SOME(h, headers.get(hMyHeader)) {
      responseHeaders.set(hMyHeader, kj::str("respond-", h));
    }

    if (url == "/return-error") {
      response.send(404, "Not Found", responseHeaders, uint64_t(0));
      return kj::READY_NOW;
    } else if (url == "/websocket") {
      auto ws = response.acceptWebSocket(responseHeaders);
      return doWebSocket(*ws, "start-inline").attach(kj::mv(ws));
    } else {
      KJ_FAIL_ASSERT("unexpected path", url);
    }
  }